

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ApiTokenize(Fts5Context *pCtx,char *pText,int nText,void *pUserData,
                   _func_int_void_ptr_int_char_ptr_int_int_int *xToken)

{
  int iVar1;
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  char *in_RDI;
  void *in_R8;
  Fts5Context *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar1 = fts5ApiTokenize_v2(unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20),
                             (char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                             (int)((ulong)in_RCX >> 0x20),in_R8,xToken);
  return iVar1;
}

Assistant:

static int fts5ApiTokenize(
  Fts5Context *pCtx,
  const char *pText, int nText,
  void *pUserData,
  int (*xToken)(void*, int, const char*, int, int, int)
){
  return fts5ApiTokenize_v2(pCtx, pText, nText, 0, 0, pUserData, xToken);
}